

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

ReservedChars __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  bool bVar1;
  ReservedChars RVar2;
  uint c;
  Token local_70;
  
  RVar2 = None;
  while( true ) {
    while( true ) {
      c = 0xffffffff;
      if (this->cursor_ < this->buffer_end_) {
        c = (uint)(byte)*this->cursor_;
      }
      bVar1 = IsIdChar(c);
      if (!bVar1) break;
      if (this->cursor_ < this->buffer_end_) {
        this->cursor_ = this->cursor_ + 1;
      }
      if (RVar2 == None) {
        RVar2 = Id;
      }
    }
    if (c != 0x22) break;
    GetStringToken(&local_70,this);
    RVar2 = Some;
  }
  return RVar2;
}

Assistant:

WastLexer::ReservedChars WastLexer::ReadReservedChars() {
  ReservedChars ret{ReservedChars::None};
  while (true) {
    auto peek = PeekChar();
    if (IsIdChar(peek)) {
      ReadChar();
      if (ret == ReservedChars::None) {
        ret = ReservedChars::Id;
      }
    } else if (peek == '"') {
      GetStringToken();
      ret = ReservedChars::Some;
    } else {
      break;
    }
  }
  return ret;
}